

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  bool bVar1;
  byte bVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  const_reference ppcVar3;
  char *name_00;
  allocator local_481;
  string local_480;
  allocator local_459;
  string local_458;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  allocator local_391;
  string local_390;
  undefined1 local_370 [8];
  cmXMLWriter xml;
  undefined1 local_318 [8];
  cmGeneratedFileStream fout;
  string filename;
  allocator local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string name;
  cmLocalGenerator *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  bVar1 = std::operator!=(&this->HomeDirectory,&this->HomeOutputDirectory);
  if (!bVar1) {
    __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmExtraEclipseCDT4Generator.cxx"
                  ,0xac,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
  }
  this_00 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_00,0);
  name.field_2._8_8_ = *ppcVar3;
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_58,(cmLocalGenerator *)name.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"Source",&local_79);
  GetPathBasename((string *)((long)&filename.field_2 + 8),&this->HomeDirectory);
  GenerateProjectName((string *)local_38,&local_58,&local_78,(string *)((long)&filename.field_2 + 8)
                     );
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout.field_0x240,&this->HomeDirectory,"/.project");
  name_00 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_318,name_00,false,None);
  bVar2 = std::ios::operator!((ios *)(local_318 + (long)*(_func_int **)((long)local_318 + -0x18)));
  if ((bVar2 & 1) == 0) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_370,(ostream *)local_318,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_370,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_390,"projectDescription",&local_391);
    cmXMLWriter::StartElement((cmXMLWriter *)local_370,&local_390);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b8,"name",&local_3b9);
    cmXMLWriter::Element<std::__cxx11::string>
              ((cmXMLWriter *)local_370,&local_3b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3e0,"comment",&local_3e1);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_370,&local_3e0,(char (*) [1])0xa67d2c);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"projects",&local_409);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_370,&local_408,(char (*) [1])0xa67d2c);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_430,"buildSpec",&local_431);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_370,&local_430,(char (*) [1])0xa67d2c);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_458,"natures",&local_459);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_370,&local_458,(char (*) [1])0xa67d2c);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_480,"linkedResources",&local_481);
    cmXMLWriter::StartElement((cmXMLWriter *)local_370,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    if ((this->SupportsVirtualFolders & 1U) != 0) {
      CreateLinksToSubprojects(this,(cmXMLWriter *)local_370,&this->HomeDirectory);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->SrcLinkedResources);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_370);
    cmXMLWriter::EndElement((cmXMLWriter *)local_370);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_370);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_370);
    xml._76_4_ = 0;
  }
  else {
    xml._76_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_318);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  std::string name =
    this->GenerateProjectName(lg->GetProjectName(), "Source",
                              this->GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  cmXMLWriter xml(fout);
  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");
  xml.Element("name", name);
  xml.Element("comment", "");
  xml.Element("projects", "");
  xml.Element("buildSpec", "");
  xml.Element("natures", "");
  xml.StartElement("linkedResources");

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeDirectory);
    this->SrcLinkedResources.clear();
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
  xml.EndDocument();
}